

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::option_without_value::option_without_value
          (option_without_value *this,string *name,char short_name,string *desc)

{
  string *in_RCX;
  undefined1 in_DL;
  string *in_RSI;
  option_base *in_RDI;
  
  option_base::option_base(in_RDI);
  in_RDI->_vptr_option_base = (_func_int **)&PTR__option_without_value_00258248;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(undefined1 *)&in_RDI[5]._vptr_option_base = in_DL;
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RCX);
  *(undefined1 *)&in_RDI[10]._vptr_option_base = 0;
  return;
}

Assistant:

option_without_value(const std::string& name, char short_name, const std::string& desc)
            : nam(name), snam(short_name), desc(desc), has(false) {}